

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::updateMedicineDetails(Shop *this)

{
  ostream *poVar1;
  int index;
  Medicine medicine;
  int local_ac;
  undefined1 local_a8 [48];
  string local_78 [32];
  string local_58 [64];
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "You need to Enter the Medicine id to Edit: So select medicine id from here"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,&local_ac);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your selected Medicine is:");
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicine(this,local_ac + -1);
  poVar1 = std::operator<<((ostream *)&std::cout,"What do you want to update? ");
  std::endl<char,std::char_traits<char>>(poVar1);
  Medicine::Medicine((Medicine *)local_a8,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)local_ac + -1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Medicine Name:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)(local_a8 + 0x10));
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Medicine Company Name:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,local_78);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Unit Price:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,(int *)(local_a8 + 4));
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Arrival date:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,local_58);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Updated Quantity date:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,(int *)(local_a8 + 8));
  Medicine::operator=((this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                      _M_impl.super__Vector_impl_data._M_start + (long)local_ac + -1,
                      (Medicine *)local_a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Edited. New Medicine List is:");
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicines(this);
  Medicine::~Medicine((Medicine *)local_a8);
  return;
}

Assistant:

void updateMedicineDetails() {
        int index;
        cout << "You need to Enter the Medicine id to Edit: So select medicine id from here" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);
        cout << "What do you want to update? " << endl;

        Medicine medicine = medicineList[index - 1];

        cout << "Enter Updated Medicine Name:" << endl;
        cin >> medicine.name;
        cout << "Enter Updated Medicine Company Name:" << endl;
        cin >> medicine.companyName;
        cout << "Enter Updated Unit Price:" << endl;
        cin >> medicine.unitePrice;
        cout << "Enter Updated Arrival date:" << endl;
        cin >> medicine.arrivalDate;
        /* cout<<"Enter Updated Expire date:"<<endl;
         cin>>medicine.expireDate;*/
        cout << "Enter Updated Quantity date:" << endl;
        cin >> medicine.quantity;

        medicineList[index - 1] = medicine;

        cout << "Edited. New Medicine List is:" << endl;
        printMedicines();
    }